

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ospf-packet.cc
# Opt level: O0

void __thiscall RouterLsaContent::RouterLsaContent(RouterLsaContent *this,istream *is)

{
  initializer_list<unsigned_short> __l;
  uint16_t uVar1;
  uint64_t uVar2;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *this_00;
  char *in_RSI;
  undefined8 *in_RDI;
  uint16_t temp_tos [2];
  uint8_t num;
  uint8_t arr [4];
  value_type *in_stack_ffffffffffffff68;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  *this_01;
  allocator_type *__a;
  undefined4 in_stack_ffffffffffffffa0;
  unsigned_short uVar3;
  iterator puVar4;
  size_type sVar5;
  unsigned_short local_2a;
  uint16_t local_28;
  char local_25;
  uint8_t local_14 [4];
  char *local_10;
  
  *in_RDI = &PTR__RouterLsaContent_0017d5c0;
  __a = (allocator_type *)(in_RDI + 3);
  local_10 = in_RSI;
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::vector((vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
            *)0x1545c0);
  std::istream::read(local_10,(long)local_14);
  uVar2 = arr2num(local_14,'\x04');
  *(int *)(in_RDI + 1) = (int)uVar2;
  std::istream::read(local_10,(long)local_14);
  this_00 = (vector<unsigned_short,_std::allocator<unsigned_short>_> *)arr2num(local_14,'\x04');
  *(int *)((long)in_RDI + 0xc) = (int)this_00;
  std::istream::read(local_10,(long)(in_RDI + 2));
  std::istream::read(local_10,(long)in_RDI + 0x11);
  std::istream::read(local_10,(long)in_RDI + 0x12);
  uVar1 = ntohs(*(uint16_t *)((long)in_RDI + 0x12));
  *(uint16_t *)((long)in_RDI + 0x12) = uVar1;
  for (local_25 = *(char *)((long)in_RDI + 0x11); local_25 != '\0'; local_25 = local_25 + -1) {
    std::istream::read(local_10,(long)&local_2a);
    this_01 = (vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
               *)(in_RDI + 3);
    uVar3 = local_2a;
    uVar1 = ntohs(local_28);
    puVar4 = (iterator)&stack0xffffffffffffffa4;
    sVar5 = 2;
    std::allocator<unsigned_short>::allocator((allocator<unsigned_short> *)0x154727);
    __l._M_len = sVar5;
    __l._M_array = puVar4;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
               CONCAT26(uVar1,CONCAT24(uVar3,in_stack_ffffffffffffffa0)),__l,__a);
    std::
    vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
    ::push_back(this_01,in_stack_ffffffffffffff68);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector(this_00);
    std::allocator<unsigned_short>::~allocator((allocator<unsigned_short> *)0x154767);
  }
  return;
}

Assistant:

RouterLsaContent::RouterLsaContent(std::istream& is)
{
    uint8_t arr[4];
    is.read((char*)&arr, 4);
    link_id = arr2num(arr, 4);
    is.read((char*)&arr, 4);
    link_data = arr2num(arr, 4);
    is.read((char*)&link_type, 1);
    is.read((char*)&tos_num, 1);
    is.read((char*)&tos0_metric, 2);
    tos0_metric = ntohs(tos0_metric);
    uint8_t num = tos_num;
    while (num != 0)
    {
        // 8bit: tos; 8bit: reserve; 16bit tos_metric. 可以没有。
        //数组的第一元素的值等于tos的值，因为保留字节通常为0，再加上网络字节顺序。
        //数组的第二元素的值还需要字节顺序转换。
        uint16_t temp_tos[2];
        is.read((char*)&temp_tos, 4);
        toses.push_back({temp_tos[0], ntohs(temp_tos[1])});
        --num;
    }
}